

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

BOOL SetFileAttributesW(LPCWSTR lpFileName,DWORD dwFileAttributes)

{
  int iVar1;
  DWORD DVar2;
  size_t sVar3;
  char *lpMultiByteStr;
  long in_FS_OFFSET;
  BOOL local_80;
  DWORD local_7c;
  BOOL bRet;
  DWORD dwLastError;
  int size;
  int length;
  char *name;
  CPalThread *pThread;
  DWORD dwFileAttributes_local;
  LPCWSTR lpFileName_local;
  PathCharString namePS;
  
  namePS.m_count = *(SIZE_T *)(in_FS_OFFSET + 0x28);
  StackString<32UL,_char>::StackString((StackString<32UL,_char> *)&lpFileName_local);
  local_7c = 0;
  local_80 = 0;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  CorUnix::InternalGetCurrentThread();
  if (lpFileName == (LPCWSTR)0x0) {
    local_7c = 3;
  }
  else {
    sVar3 = PAL_wcslen(lpFileName);
    iVar1 = ((int)sVar3 + 1) * MaxWCharToAcpLengthFactor;
    lpMultiByteStr =
         StackString<32UL,_char>::OpenStringBuffer
                   ((StackString<32UL,_char> *)&lpFileName_local,(long)iVar1);
    if (lpMultiByteStr == (char *)0x0) {
      local_7c = 8;
    }
    else {
      iVar1 = WideCharToMultiByte(0,0,lpFileName,-1,lpMultiByteStr,iVar1,(LPCSTR)0x0,(LPBOOL)0x0);
      StackString<32UL,_char>::CloseBuffer((StackString<32UL,_char> *)&lpFileName_local,(long)iVar1)
      ;
      if (iVar1 == 0) {
        DVar2 = GetLastError();
        if (DVar2 == 0x7a) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          local_7c = 0xce;
        }
        else {
          fprintf(_stderr,"] %s %s:%d","SetFileAttributesW",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                  ,0x7d8);
          fprintf(_stderr,"WideCharToMultiByte failure! error is %d\n",(ulong)DVar2);
          local_7c = 0x57;
        }
      }
      else {
        local_80 = SetFileAttributesA(lpMultiByteStr,dwFileAttributes);
      }
    }
  }
  if (local_7c != 0) {
    CorUnix::CPalThread::SetLastError(local_7c);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    StackString<32UL,_char>::~StackString((StackString<32UL,_char> *)&lpFileName_local);
    if (*(SIZE_T *)(in_FS_OFFSET + 0x28) != namePS.m_count) {
      __stack_chk_fail();
    }
    return local_80;
  }
  abort();
}

Assistant:

BOOL
PALAPI
SetFileAttributesW(
           IN LPCWSTR lpFileName,
           IN DWORD dwFileAttributes)
{
    CPalThread *pThread;
    char * name;
    PathCharString namePS;
    int length = 0;
    int  size;

    DWORD dwLastError = 0;
    BOOL  bRet = FALSE;

    PERF_ENTRY(SetFileAttributesW);
    ENTRY("SetFileAttributesW(lpFileName=%p (%S), dwFileAttributes=%#x)\n",
        lpFileName?lpFileName:W16_NULLSTRING,
        lpFileName?lpFileName:W16_NULLSTRING, dwFileAttributes);
    
    pThread = InternalGetCurrentThread();
    if (lpFileName == NULL) 
    {
        dwLastError = ERROR_PATH_NOT_FOUND;
        goto done;
    }
    
    length = (PAL_wcslen(lpFileName)+1) * MaxWCharToAcpLengthFactor;
    name = namePS.OpenStringBuffer(length);
    if (NULL == name)
    {
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    size = WideCharToMultiByte( CP_ACP, 0, lpFileName, -1, name, length,
                                NULL, NULL );
    namePS.CloseBuffer(size);
    
    if( size == 0 )
    {
        dwLastError = GetLastError();
        if( dwLastError == ERROR_INSUFFICIENT_BUFFER )
        {
            WARN("lpFileName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
            dwLastError = ERROR_FILENAME_EXCED_RANGE;
        }
        else
        {
            ASSERT("WideCharToMultiByte failure! error is %d\n", dwLastError);
            dwLastError = ERROR_INVALID_PARAMETER;
        }
        goto done;
    }
    bRet = SetFileAttributesA(name,dwFileAttributes);

done:
    if (dwLastError) pThread->SetLastError(dwLastError);

    LOGEXIT("SetFileAttributes returns BOOL %d\n", bRet);
    PERF_EXIT(SetFileAttributesW);
    return bRet;
}